

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUCS4Transcoder.cpp
# Opt level: O0

XMLSize_t __thiscall
xercesc_4_0::XMLUCS4Transcoder::transcodeTo
          (XMLUCS4Transcoder *this,XMLCh *srcData,XMLSize_t srcCount,XMLByte *toFill,
          XMLSize_t maxBytes,XMLSize_t *charsEaten,UnRepOpts param_6)

{
  XMLCh XVar1;
  XMLCh XVar2;
  UCS4Ch UVar3;
  XMLCh *pXVar4;
  TranscodingException *this_00;
  MemoryManager *memoryManager;
  UCS4Ch tmpCh;
  XMLInt32 SURROGATE_OFFSET;
  XMLCh curCh;
  XMLCh trailCh;
  UCS4Ch *outEnd;
  UCS4Ch *outPtr;
  XMLCh *srcEnd;
  XMLCh *srcPtr;
  XMLSize_t *charsEaten_local;
  XMLSize_t maxBytes_local;
  XMLByte *toFill_local;
  XMLSize_t srcCount_local;
  XMLCh *srcData_local;
  XMLUCS4Transcoder *this_local;
  
  srcEnd = srcData;
  for (outEnd = (UCS4Ch *)toFill;
      outEnd < toFill + (maxBytes & 0xfffffffffffffffc) && srcEnd < srcData + srcCount;
      outEnd = outEnd + 1) {
    XVar1 = *srcEnd;
    if (((ushort)XVar1 < 0xd800) || (0xdbff < (ushort)XVar1)) {
      if ((this->fSwapped & 1U) == 0) {
        *outEnd = (uint)(ushort)XVar1;
      }
      else {
        UVar3 = BitOps::swapBytes((uint)(ushort)XVar1);
        *outEnd = UVar3;
      }
      srcEnd = srcEnd + 1;
    }
    else {
      if (srcEnd + 1 == srcData + srcCount) break;
      pXVar4 = srcEnd + 1;
      srcEnd = srcEnd + 2;
      XVar2 = *pXVar4;
      if (((ushort)XVar2 < 0xdc00) || (0xdfff < (ushort)XVar2)) {
        this_00 = (TranscodingException *)__cxa_allocate_exception(0x30);
        memoryManager = XMLTranscoder::getMemoryManager(&this->super_XMLTranscoder);
        TranscodingException::TranscodingException
                  (this_00,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLUCS4Transcoder.cpp"
                   ,0xca,Trans_BadTrailingSurrogate,memoryManager);
        __cxa_throw(this_00,&TranscodingException::typeinfo,
                    TranscodingException::~TranscodingException);
      }
      *outEnd = (uint)(ushort)XVar1 * 0x400 + (uint)(ushort)XVar2 + L'\xfca02400';
    }
  }
  *charsEaten = (long)srcEnd - (long)srcData >> 1;
  return (long)outEnd - (long)toFill;
}

Assistant:

XMLSize_t
XMLUCS4Transcoder::transcodeTo( const   XMLCh* const    srcData
                                , const XMLSize_t       srcCount
                                ,       XMLByte* const  toFill
                                , const XMLSize_t       maxBytes
                                ,       XMLSize_t&      charsEaten
                                , const UnRepOpts)
{
    //
    //  Get pointers to the start and end of the source buffer, which
    //  is in terms of XMLCh chars.
    //
    const XMLCh*  srcPtr = srcData;
    const XMLCh*  srcEnd = srcData + srcCount;

    //
    //  Get pointers to the start and end of the target buffer, in terms
    //  of UCS-4 chars.
    //
    UCS4Ch*   outPtr = reinterpret_cast<UCS4Ch*>(toFill);
    UCS4Ch*   outEnd = outPtr + (maxBytes / sizeof(UCS4Ch));

    //
    //  Now loop until we either run out of source characters or we
    //  fill up our output buffer.
    //
    XMLCh trailCh;
    while ((outPtr < outEnd) && (srcPtr < srcEnd))
    {
        //
        //  Get out an XMLCh char from the source. Don't bump up the
        //  pointer yet, since it might be a leading for which we don't
        //  have the trailing.
        //
        const XMLCh curCh = *srcPtr;

        //
        //  If its a leading char of a surrogate pair handle it one way,
        //  else just cast it over into the target.
        //
        if ((curCh >= 0xD800) && (curCh <= 0xDBFF))
        {
            //
            //  Ok, we have to have another source char available or we
            //  just give up without eating the leading char.
            //
            if (srcPtr + 1 == srcEnd)
                break;

            //
            //  We have the trailing char, so eat the first char and the
            //  trailing char from the source.
            //
            srcPtr++;
            trailCh = *srcPtr++;

            //
            //  Then make sure its a legal trailing char. If not, throw
            //  an exception.
            //
            if ( !( (trailCh >= 0xDC00) && (trailCh <= 0xDFFF) ) )
                ThrowXMLwithMemMgr(TranscodingException, XMLExcepts::Trans_BadTrailingSurrogate, getMemoryManager());

            // And now combine the two into a single output char
            const XMLInt32 SURROGATE_OFFSET = 0x10000 - (0xD800 << 10) - 0xDC00;
            *outPtr++ = (curCh << 10) + trailCh + SURROGATE_OFFSET;
        }
         else
        {
            //
            //  Its just a char, so we can take it as is. If we need to
            //  swap it, then swap it. Because of flakey compilers, use
            //  a temp first.
            //
            const UCS4Ch tmpCh = UCS4Ch(curCh);
            if (fSwapped)
                *outPtr++ = BitOps::swapBytes(tmpCh);
            else
                *outPtr++ = tmpCh;

            // Bump the source pointer
            srcPtr++;
        }
    }

    // Set the chars we ate from the source
    charsEaten = srcPtr - srcData;

    // Return the bytes we wrote to the output
    return ((XMLByte*)outPtr) - toFill;
}